

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugmodes.c
# Opt level: O0

void av1_print_uncompressed_frame_header(uint8_t *data,int size,char *filename)

{
  char *in_RDX;
  int in_ESI;
  void *in_RDI;
  uint8_t zero;
  FILE *hdrFile;
  undefined1 local_21;
  FILE *local_20;
  int local_c;
  void *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_20 = fopen64(in_RDX,"w");
  fwrite(local_8,(long)local_c,1,local_20);
  local_21 = 0;
  fseek(local_20,1,0);
  fwrite(&local_21,1,1,local_20);
  fclose(local_20);
  return;
}

Assistant:

void av1_print_uncompressed_frame_header(const uint8_t *data, int size,
                                         const char *filename) {
  FILE *hdrFile = fopen(filename, "w");
  fwrite(data, size, sizeof(uint8_t), hdrFile);

  // Reset order hints(7bit + a previous bit) to 0, so that all camera frame
  // headers are identical in large scale coding.
  uint8_t zero = 0;
  fseek(hdrFile, 1, SEEK_SET);
  // Reset second byte.
  fwrite(&zero, 1, sizeof(uint8_t), hdrFile);
  fclose(hdrFile);
}